

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  int *piVar2;
  JBLOCKROW paJVar3;
  jpeg_error_mgr *pjVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var13;
  long lVar14;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar5 = *(int *)((long)&pjVar1[4].start_pass + 4);
    if (iVar5 == 0) {
      process_restart(cinfo);
      iVar5 = *(int *)((long)&pjVar1[4].start_pass + 4);
    }
    *(int *)((long)&pjVar1[4].start_pass + 4) = iVar5 + -1;
  }
  if (*(int *)&pjVar1[2].start_pass != -1) {
    piVar2 = cinfo->natural_order;
    paJVar3 = *MCU_data;
    iVar5 = cinfo->cur_comp_info[0]->ac_tbl_no;
    for (iVar12 = cinfo->Ss; iVar12 <= cinfo->Se; iVar12 = iVar12 + (int)lVar10 + 1) {
      p_Var13 = (&pjVar1[0xc].decode_mcu)[iVar5];
      lVar10 = (long)(iVar12 * 3 + -3);
      iVar6 = arith_decode(cinfo,(uchar *)(p_Var13 + lVar10));
      if (iVar6 != 0) {
        return 1;
      }
      p_Var13 = p_Var13 + lVar10 + 2;
      lVar10 = 0;
      while (iVar6 = arith_decode(cinfo,(uchar *)(p_Var13 + -1)), iVar6 == 0) {
        p_Var13 = p_Var13 + 3;
        lVar10 = lVar10 + 1;
        if (cinfo->Se <= iVar12 + -1 + (int)lVar10) goto LAB_00112ed9;
      }
      iVar6 = arith_decode(cinfo,(uchar *)&pjVar1[0x14].decode_mcu);
      iVar7 = arith_decode(cinfo,(uchar *)p_Var13);
      if (iVar7 == 0) {
        uVar11 = 0;
      }
      else {
        iVar7 = arith_decode(cinfo,(uchar *)p_Var13);
        uVar11 = 1;
        if (iVar7 != 0) {
          lVar14 = 0xbd;
          if ((int)(uint)cinfo->arith_ac_K[iVar5] < iVar12 + (int)lVar10) {
            lVar14 = 0xd9;
          }
          p_Var13 = (&pjVar1[0xc].decode_mcu)[iVar5] + lVar14;
          uVar11 = 2;
          while (iVar7 = arith_decode(cinfo,(uchar *)p_Var13), iVar7 != 0) {
            uVar11 = uVar11 * 2;
            if (uVar11 == 0x8000) {
LAB_00112ed9:
              pjVar4 = cinfo->err;
              pjVar4->msg_code = 0x75;
              (*pjVar4->emit_message)((j_common_ptr)cinfo,-1);
              *(undefined4 *)&pjVar1[2].start_pass = 0xffffffff;
              return 1;
            }
            p_Var13 = p_Var13 + 1;
          }
        }
      }
      uVar9 = uVar11;
      while (1 < uVar9) {
        uVar9 = (int)uVar9 >> 1;
        uVar8 = arith_decode(cinfo,(uchar *)(p_Var13 + 0xe));
        if (uVar8 != 0) {
          uVar8 = uVar9;
        }
        uVar11 = uVar11 | uVar8;
      }
      uVar9 = ~uVar11;
      if (iVar6 == 0) {
        uVar9 = uVar11 + 1;
      }
      (*paJVar3)[piVar2[iVar12 + lVar10]] = (JCOEF)(uVar9 << ((byte)cinfo->Al & 0x1f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

  /* Figure F.20: Decode_AC_coefficients */
  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (arith_decode(cinfo, st)) break;		/* EOB flag */
    while (arith_decode(cinfo, st + 1) == 0) {
      st += 3; k++;
      if (k > cinfo->Se) {
	WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	entropy->ct = -1;			/* spectral overflow */
	return TRUE;
      }
    }
    /* Figure F.21: Decoding nonzero value v */
    /* Figure F.22: Decoding the sign of v */
    sign = arith_decode(cinfo, entropy->fixed_bin);
    st += 2;
    /* Figure F.23: Decoding the magnitude category of v */
    if ((m = arith_decode(cinfo, st)) != 0) {
      if (arith_decode(cinfo, st)) {
	m <<= 1;
	st = entropy->ac_stats[tbl] +
	     (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
    }
    v = m;
    /* Figure F.24: Decoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      if (arith_decode(cinfo, st)) v |= m;
    v += 1; if (sign) v = -v;
    /* Scale and output coefficient in natural (dezigzagged) order */
    (*block)[natural_order[k]] = (JCOEF) (v << cinfo->Al);
  }

  return TRUE;
}